

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int sasl_mechanisms_set_sasl_server_mechanisms
              (SASL_MECHANISMS_HANDLE sasl_mechanisms,AMQP_VALUE sasl_server_mechanisms_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE sasl_server_mechanisms_amqp_value;
  SASL_MECHANISMS_INSTANCE *sasl_mechanisms_instance;
  int result;
  AMQP_VALUE sasl_server_mechanisms_value_local;
  SASL_MECHANISMS_HANDLE sasl_mechanisms_local;
  
  if (sasl_mechanisms == (SASL_MECHANISMS_HANDLE)0x0) {
    sasl_mechanisms_instance._4_4_ = 0x28b7;
  }
  else {
    if (sasl_server_mechanisms_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(sasl_server_mechanisms_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      sasl_mechanisms_instance._4_4_ = 0x28c7;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(sasl_mechanisms->composite_value,0,local_30);
      if (iVar1 == 0) {
        sasl_mechanisms_instance._4_4_ = 0;
      }
      else {
        sasl_mechanisms_instance._4_4_ = 0x28cd;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return sasl_mechanisms_instance._4_4_;
}

Assistant:

int sasl_mechanisms_set_sasl_server_mechanisms(SASL_MECHANISMS_HANDLE sasl_mechanisms, AMQP_VALUE sasl_server_mechanisms_value)
{
    int result;

    if (sasl_mechanisms == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)sasl_mechanisms;
        AMQP_VALUE sasl_server_mechanisms_amqp_value;
        if (sasl_server_mechanisms_value == NULL)
        {
            sasl_server_mechanisms_amqp_value = NULL;
        }
        else
        {
            sasl_server_mechanisms_amqp_value = amqpvalue_clone(sasl_server_mechanisms_value);
        }
        if (sasl_server_mechanisms_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(sasl_mechanisms_instance->composite_value, 0, sasl_server_mechanisms_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(sasl_server_mechanisms_amqp_value);
        }
    }

    return result;
}